

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QExpression.hpp
# Opt level: O0

void __thiscall Qentem::QExpression::operator/=(QExpression *this,QExpression *right)

{
  ExpressionType EVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  QExpression *right_local;
  QExpression *this_local;
  
  auVar2 = in_ZMM0._0_16_;
  if (this->Type == NaturalNumber) {
    auVar2 = vcvtusi2sd_avx512f(auVar2,(this->field_0).SubExpressions.storage_);
    (this->field_0).SubExpressions.storage_ = auVar2._0_8_;
    this->Type = RealNumber;
  }
  else if (this->Type == IntegerNumber) {
    auVar2._0_8_ = (double)(long)(this->field_0).SubExpressions.storage_;
    auVar2._8_8_ = in_ZMM0._8_8_;
    *(double *)&this->field_0 = auVar2._0_8_;
    this->Type = RealNumber;
  }
  EVar1 = right->Type;
  if (EVar1 == RealNumber) {
    *(double *)&this->field_0 = *(double *)&this->field_0 / *(double *)&right->field_0;
  }
  else if (EVar1 == NaturalNumber) {
    auVar2 = vcvtusi2sd_avx512f(auVar2,(right->field_0).SubExpressions.storage_);
    *(double *)&this->field_0 = *(double *)&this->field_0 / auVar2._0_8_;
  }
  else if (EVar1 == IntegerNumber) {
    *(double *)&this->field_0 =
         *(double *)&this->field_0 / (double)(long)(right->field_0).SubExpressions.storage_;
  }
  return;
}

Assistant:

void operator/=(const QExpression &right) noexcept {
        switch (Type) {
            case ExpressionType::NaturalNumber: {
                Value.Number.Real = double(Value.Number.Natural);
                Type              = ExpressionType::RealNumber;
                break;
            }

            case ExpressionType::IntegerNumber: {
                Value.Number.Real = double(Value.Number.Integer);
                Type              = ExpressionType::RealNumber;
                break;
            }

            default: {
            }
        }

        switch (right.Type) {
            case ExpressionType::NaturalNumber: {
                Value.Number.Real /= double(right.Value.Number.Natural);
                break;
            }

            case ExpressionType::IntegerNumber: {
                Value.Number.Real /= double(right.Value.Number.Integer);
                break;
            }

            case ExpressionType::RealNumber: {
                Value.Number.Real /= right.Value.Number.Real;
                break;
            }

            default: {
            }
        }
    }